

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

void clip_build_img_from_pixels(uchar *rgb_pixels,int nx,int ny,clip_image_u8 *img)

{
  uchar *__dest;
  size_type __n;
  undefined4 *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  void *in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  
  *in_RCX = in_ESI;
  in_RCX[1] = in_EDX;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (unaff_retaddr,(size_type)in_RDI);
  __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x1962c6);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RCX + 2));
  memcpy(__dest,in_RDI,__n);
  return;
}

Assistant:

void clip_build_img_from_pixels(const unsigned char * rgb_pixels, int nx, int ny, clip_image_u8 * img) {
    img->nx = nx;
    img->ny = ny;
    img->buf.resize(3 * nx * ny);
    memcpy(img->buf.data(), rgb_pixels, img->buf.size());
}